

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O3

void __thiscall aalcalc::loadoccurrence<occurrence>(aalcalc *this,occurrence *occ,FILE *fin)

{
  int *__args;
  int iVar1;
  iterator __position;
  size_t sVar2;
  vector<int,std::allocator<int>> *this_00;
  _Base_ptr p_Var3;
  const_iterator __pos;
  _Base_ptr p_Var4;
  int *piVar5;
  occurrence *this_01;
  bool bVar6;
  tuple<> tStack_31;
  _Head_base<0UL,_int_&&,_false> _Stack_30;
  
  _Stack_30._M_head_impl = (int *)0x104b4e;
  fread(&this->no_of_periods_,4,1,(FILE *)fin);
  piVar5 = (int *)0xc;
  _Stack_30._M_head_impl = (int *)0x104b63;
  this_01 = occ;
  sVar2 = fread(occ,0xc,1,(FILE *)fin);
  if (sVar2 != 0) {
    __args = &occ->period_no;
    do {
      _Stack_30._M_head_impl = (int *)0x104b7b;
      this_00 = (vector<int,std::allocator<int>> *)
                std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&this->event_to_period_,&occ->event_id);
      __position._M_current = *(int **)(this_00 + 8);
      if (__position._M_current == *(int **)(this_00 + 0x10)) {
        _Stack_30._M_head_impl = (int *)0x104ba0;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this_00,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        *(int **)(this_00 + 8) = __position._M_current + 1;
      }
      if (this->max_period_no_ < *__args) {
        this->max_period_no_ = *__args;
      }
      piVar5 = (int *)0xc;
      _Stack_30._M_head_impl = (int *)0x104bc3;
      this_01 = occ;
      sVar2 = fread(occ,0xc,1,(FILE *)fin);
    } while (sVar2 != 0);
  }
  if (this->no_of_periods_ < this->max_period_no_) {
    _Stack_30._M_head_impl =
         (int *)std::
                map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
                ::operator[];
    loadoccurrence<occurrence>();
    p_Var4 = *(_Base_ptr *)&this_01[1].period_no;
    __pos._M_node = (_Base_ptr)&this_01->occ_date_id;
    if (p_Var4 != (_Base_ptr)0x0) {
      iVar1 = *piVar5;
      p_Var3 = __pos._M_node;
      do {
        if (iVar1 <= (int)p_Var4[1]._M_color) {
          p_Var3 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < iVar1];
      } while (p_Var4 != (_Base_ptr)0x0);
      bVar6 = p_Var3 != __pos._M_node;
      __pos._M_node = p_Var3;
      if ((bVar6) && ((int)p_Var3[1]._M_color <= iVar1)) {
        return;
      }
    }
    _Stack_30._M_head_impl = piVar5;
    std::
    _Rb_tree<int,std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>,std::_Select1st<std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>>>
    ::_M_emplace_hint_unique<std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<>>
              ((_Rb_tree<int,std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>,std::_Select1st<std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>>>
                *)this_01,__pos,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<int_&&> *)&_Stack_30,&tStack_31);
    return;
  }
  fclose((FILE *)fin);
  return;
}

Assistant:

void aalcalc::loadoccurrence(T &occ, FILE * fin)
{

	size_t i = fread(&no_of_periods_, sizeof(no_of_periods_), 1, fin);
	i = fread(&occ, sizeof(occ), 1, fin);
	while (i != 0) {
		event_to_period_[occ.event_id].push_back(occ.period_no);
		if (max_period_no_ < occ.period_no) max_period_no_ = occ.period_no;
		i = fread(&occ, sizeof(occ), 1, fin);
	}
	
	if (max_period_no_ > no_of_periods_) {
		fprintf(stderr, "FATAL: Period numbers are not contigious\n");
		exit(-1);
	}
	fclose(fin);

}